

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::InstDebugPrintfPass::Process(InstDebugPrintfPass *this)

{
  uint32_t uVar1;
  Module *this_00;
  InstDebugPrintfPass *this_local;
  
  this_00 = Pass::get_module((Pass *)this);
  uVar1 = Module::GetExtInstImportId(this_00,"NonSemantic.DebugPrintf");
  *(uint32_t *)&(this->super_InstrumentPass).field_0x244 = uVar1;
  if (*(int *)&(this->super_InstrumentPass).field_0x244 == 0) {
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    InitializeInstDebugPrintf(this);
    this_local._4_4_ = ProcessImpl(this);
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status InstDebugPrintfPass::Process() {
  ext_inst_printf_id_ =
      get_module()->GetExtInstImportId("NonSemantic.DebugPrintf");
  if (ext_inst_printf_id_ == 0) return Status::SuccessWithoutChange;
  InitializeInstDebugPrintf();
  return ProcessImpl();
}